

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O0

QStringList * __thiscall
QUrlQuery::allQueryItemValues(QUrlQuery *this,QString *key,ComponentFormattingOptions encoding)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QString *key_00;
  QUrlQueryPrivate *pQVar4;
  qsizetype qVar5;
  QString *in_RDX;
  QUrlQueryPrivate *in_RSI;
  QStringList *in_RDI;
  long in_FS_OFFSET;
  QFlagsStorage<QUrl::ComponentFormattingOption> in_stack_00000024;
  int idx;
  QStringList *result;
  QString encodedKey;
  rvalue_ref in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  undefined8 in_stack_ffffffffffffff58;
  int from;
  QString *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  int local_78;
  QString *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 uVar6;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = 0;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0x315073);
  bVar2 = ::QSharedDataPointer::operator_cast_to_bool
                    ((QSharedDataPointer<QUrlQueryPrivate> *)0x31507d);
  if (bVar2) {
    QSharedDataPointer<QUrlQueryPrivate>::operator->
              ((QSharedDataPointer<QUrlQueryPrivate> *)0x3150b1);
    QUrlQueryPrivate::recodeFromUser
              ((QUrlQueryPrivate *)CONCAT17(uVar6,in_stack_ffffffffffffff98),
               in_stack_ffffffffffffff90);
    QSharedDataPointer<QUrlQueryPrivate>::operator->
              ((QSharedDataPointer<QUrlQueryPrivate> *)0x3150d2);
    iVar3 = QUrlQueryPrivate::findRecodedKey
                      ((QUrlQueryPrivate *)
                       CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                       in_stack_ffffffffffffff60,iVar3);
    local_78 = iVar3;
    while( true ) {
      key_00 = (QString *)(long)local_78;
      pQVar4 = QSharedDataPointer<QUrlQueryPrivate>::operator->
                         ((QSharedDataPointer<QUrlQueryPrivate> *)0x315106);
      qVar5 = QList<std::pair<QString,_QString>_>::size(&pQVar4->itemList);
      if (qVar5 <= (long)key_00) break;
      pQVar4 = QSharedDataPointer<QUrlQueryPrivate>::operator->
                         ((QSharedDataPointer<QUrlQueryPrivate> *)0x31512d);
      from = (int)((ulong)pQVar4 >> 0x20);
      QSharedDataPointer<QUrlQueryPrivate>::operator->
                ((QSharedDataPointer<QUrlQueryPrivate> *)0x31513c);
      QList<std::pair<QString,_QString>_>::at
                ((QList<std::pair<QString,_QString>_> *)
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 (qsizetype)in_stack_ffffffffffffff48);
      QUrlQueryPrivate::recodeToUser(in_RSI,in_RDX,(ComponentFormattingOptions)in_stack_00000024.i);
      QList<QString>::operator<<
                ((QList<QString> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48);
      QString::~QString((QString *)0x31518f);
      QSharedDataPointer<QUrlQueryPrivate>::operator->
                ((QSharedDataPointer<QUrlQueryPrivate> *)0x315199);
      in_stack_ffffffffffffff54 =
           QUrlQueryPrivate::findRecodedKey
                     ((QUrlQueryPrivate *)CONCAT44(iVar3,in_stack_ffffffffffffff68),key_00,from);
      local_78 = in_stack_ffffffffffffff54;
    }
    QString::~QString((QString *)0x315218);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QUrlQuery::allQueryItemValues(const QString &key, QUrl::ComponentFormattingOptions encoding) const
{
    QStringList result;
    if (d) {
        QString encodedKey = d->recodeFromUser(key);
        int idx = d->findRecodedKey(encodedKey);
        while (idx < d->itemList.size()) {
            result << d->recodeToUser(d->itemList.at(idx).second, encoding);
            idx = d->findRecodedKey(encodedKey, idx + 1);
        }
    }
    return result;
}